

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O2

boolean keymatch(char *arg,char *keyword,int minchars)

{
  char cVar1;
  ushort **ppuVar2;
  int __c;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    __c = (int)arg[lVar3];
    if (arg[lVar3] == '\0') {
      return (uint)(minchars <= (int)lVar3);
    }
    cVar1 = keyword[lVar3];
    if (cVar1 == '\0') break;
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)__c * 2 + 1) & 1) != 0) {
      __c = tolower(__c);
    }
    if (__c != cVar1) {
      return 0;
    }
    lVar3 = lVar3 + 1;
  }
  return 0;
}

Assistant:

GLOBAL(boolean)
keymatch(char *arg, const char *keyword, int minchars)
{
  register int ca, ck;
  register int nmatched = 0;

  while ((ca = *arg++) != '\0') {
    if ((ck = *keyword++) == '\0')
      return FALSE;             /* arg longer than keyword, no good */
    if (isupper(ca))            /* force arg to lcase (assume ck is already) */
      ca = tolower(ca);
    if (ca != ck)
      return FALSE;             /* no good */
    nmatched++;                 /* count matched characters */
  }
  /* reached end of argument; fail if it's too short for unique abbrev */
  if (nmatched < minchars)
    return FALSE;
  return TRUE;                  /* A-OK */
}